

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O1

string * __thiscall
ast::BlockStmt::toString_abi_cxx11_(string *__return_storage_ptr__,BlockStmt *this)

{
  pointer ppSVar1;
  pointer ppSVar2;
  ostringstream msg;
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"{",1);
  std::ios::widen((char)local_198 + (char)*(undefined8 *)(local_198[0] + -0x18));
  std::ostream::put((char)local_198);
  std::ostream::flush();
  ppSVar1 = (this->Stmts).super__Vector_base<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppSVar2 = (this->Stmts).super__Vector_base<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppSVar2 != ppSVar1; ppSVar2 = ppSVar2 + 1) {
    operator<<((ostream *)local_198,*ppSVar2);
    std::ios::widen((char)*(undefined8 *)(local_198[0] + -0x18) + (char)local_198);
    std::ostream::put((char)local_198);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"}",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::BlockStmt::toString() const {
    std::ostringstream msg;
    msg << "{" << std::endl;
    for(auto stmt : Stmts){
        msg << stmt;
        msg << std::endl;
    }
    msg << "}";
    return msg.str();
}